

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time.h
# Opt level: O0

int64_t absl::lts_20250127::ToInt64Microseconds(Duration d)

{
  uint32_t uVar1;
  int64_t iVar2;
  uint32_t in_EDX;
  undefined8 extraout_RDX;
  HiRep this;
  Duration d_00;
  Duration d_01;
  Duration d_02;
  Duration DVar3;
  Duration d_local;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  
  DVar3.rep_hi_.lo_ = d.rep_lo_;
  this = d.rep_hi_;
  DVar3.rep_hi_.hi_ = 0;
  DVar3.rep_lo_ = in_EDX;
  iVar2 = time_internal::GetRepHi((time_internal *)this,DVar3);
  if ((-1 < iVar2) &&
     (d_00.rep_hi_.hi_ = 0, d_00.rep_hi_.lo_ = DVar3.rep_hi_.lo_,
     d_00.rep_lo_ = (uint32_t)extraout_RDX,
     iVar2 = time_internal::GetRepHi((time_internal *)this,d_00), iVar2 >> 0x2b == 0)) {
    d_01.rep_hi_.hi_ = 0;
    d_01.rep_hi_.lo_ = DVar3.rep_hi_.lo_;
    d_01.rep_lo_ = (uint32_t)extraout_RDX_00;
    iVar2 = time_internal::GetRepHi((time_internal *)this,d_01);
    d_02.rep_hi_.hi_ = 0;
    d_02.rep_hi_.lo_ = DVar3.rep_hi_.lo_;
    d_02.rep_lo_ = (uint32_t)extraout_RDX_01;
    uVar1 = time_internal::GetRepLo((time_internal *)this,d_02);
    return iVar2 * 1000000 + (ulong)uVar1 / 4000;
  }
  DVar3 = Microseconds<int,_0>(1);
  iVar2 = operator/(d,DVar3);
  return iVar2;
}

Assistant:

ABSL_ATTRIBUTE_CONST_FUNCTION inline int64_t ToInt64Microseconds(Duration d) {
  if (time_internal::GetRepHi(d) >= 0 &&
      time_internal::GetRepHi(d) >> 43 == 0) {
    return (time_internal::GetRepHi(d) * 1000 * 1000) +
           (time_internal::GetRepLo(d) /
            (time_internal::kTicksPerNanosecond * 1000));
  }
  return d / Microseconds(1);
}